

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int ghc::filesystem::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  bool bVar2;
  EnableBitmask<ghc::filesystem::copy_options> EVar3;
  int extraout_EAX;
  directory_entry *pdVar4;
  EVP_PKEY_CTX *dst_00;
  path *this;
  error_code *in_RCX;
  copy_options in_DX;
  error_code eVar5;
  bool local_1fa;
  bool local_1f9;
  path local_1e8;
  path local_1c8;
  directory_iterator local_1a8;
  undefined1 local_198 [8];
  directory_iterator iter;
  file_status local_180;
  int local_178;
  undefined4 uStack_174;
  error_category *local_170;
  file_status local_168;
  path local_160;
  path local_140;
  file_status local_120;
  path local_118;
  file_status local_f8;
  int local_f0;
  undefined4 uStack_ec;
  error_category *local_e8;
  file_status local_e0;
  file_status local_d8;
  int local_d0;
  undefined4 uStack_cc;
  error_category *local_c8;
  byte local_b9;
  file_status local_b8;
  byte local_ad;
  file_status local_ac;
  byte local_a1;
  file_status local_a0;
  byte local_95;
  file_status local_94;
  file_status local_8c;
  file_status local_84;
  file_status local_7c;
  int local_74;
  int local_70;
  undefined4 uStack_6c;
  error_category *local_68;
  file_status local_60;
  file_status local_58;
  file_status local_50;
  file_status local_48;
  file_status fs_to;
  file_status fs_from;
  error_code tec;
  error_code *ec_local;
  copy_options options_local;
  path *to_local;
  path *from_local;
  
  std::error_code::error_code((error_code *)&fs_from);
  file_status::file_status(&fs_to);
  file_status::file_status(&local_48);
  std::error_code::clear(in_RCX);
  EVar3 = operator|(skip_symlinks,copy_symlinks);
  EVar3 = operator|(EVar3,create_symlinks);
  EVar3 = operator&(in_DX,EVar3);
  if (EVar3 == none) {
    status((filesystem *)&local_58,(path *)dst,in_RCX);
    file_status::operator=(&fs_to,&local_58);
    file_status::~file_status(&local_58);
  }
  else {
    symlink_status((filesystem *)&local_50,(path *)dst,in_RCX);
    file_status::operator=(&fs_to,&local_50);
    file_status::~file_status(&local_50);
  }
  file_status::file_status(&local_60,&fs_to);
  bVar1 = exists(&local_60);
  file_status::~file_status(&local_60);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
    if (!bVar1) {
      eVar5 = detail::make_error_code(not_found);
      local_68 = eVar5._M_cat;
      local_70 = eVar5._M_value;
      *(ulong *)in_RCX = CONCAT44(uStack_6c,local_70);
      in_RCX->_M_cat = local_68;
    }
    local_74 = 1;
    goto LAB_002c9efd;
  }
  EVar3 = operator|(skip_symlinks,create_symlinks);
  EVar3 = operator&(in_DX,EVar3);
  if (EVar3 == none) {
    status((filesystem *)&local_84,(path *)src,(error_code *)&fs_from);
    file_status::operator=(&local_48,&local_84);
    file_status::~file_status(&local_84);
  }
  else {
    symlink_status((filesystem *)&local_7c,(path *)src,(error_code *)&fs_from);
    file_status::operator=(&local_48,&local_7c);
    file_status::~file_status(&local_7c);
  }
  file_status::file_status(&local_8c,&fs_to);
  bVar1 = is_other(&local_8c);
  local_95 = 0;
  local_a1 = 0;
  local_ad = 0;
  local_b9 = 0;
  local_1f9 = true;
  if (!bVar1) {
    file_status::file_status(&local_94,&local_48);
    local_95 = 1;
    bVar1 = is_other(&local_94);
    local_1f9 = true;
    if (!bVar1) {
      file_status::file_status(&local_a0,&fs_to);
      local_a1 = 1;
      bVar1 = is_directory(&local_a0);
      if (bVar1) {
        file_status::file_status(&local_ac,&local_48);
        local_ad = 1;
        bVar1 = is_regular_file(&local_ac);
        local_1f9 = true;
        if (bVar1) goto LAB_002c97d6;
      }
      file_status::file_status(&local_b8,&local_48);
      local_b9 = 1;
      bVar1 = exists(&local_b8);
      local_1fa = false;
      if (bVar1) {
        local_1fa = equivalent((path *)dst,(path *)src,in_RCX);
      }
      local_1f9 = local_1fa;
    }
  }
LAB_002c97d6:
  if ((local_b9 & 1) != 0) {
    file_status::~file_status(&local_b8);
  }
  if ((local_ad & 1) != 0) {
    file_status::~file_status(&local_ac);
  }
  if ((local_a1 & 1) != 0) {
    file_status::~file_status(&local_a0);
  }
  if ((local_95 & 1) != 0) {
    file_status::~file_status(&local_94);
  }
  file_status::~file_status(&local_8c);
  if (local_1f9 == false) {
    file_status::file_status(&local_d8,&fs_to);
    bVar1 = is_symlink(&local_d8);
    file_status::~file_status(&local_d8);
    if (bVar1) {
      EVar3 = operator&(in_DX,skip_symlinks);
      if (EVar3 == none) {
        file_status::file_status(&local_e0,&local_48);
        bVar2 = exists(&local_e0);
        bVar1 = false;
        if (!bVar2) {
          EVar3 = operator&(in_DX,copy_symlinks);
          bVar1 = EVar3 != none;
        }
        file_status::~file_status(&local_e0);
        if (bVar1) {
          copy_symlink((path *)dst,(path *)src,in_RCX);
        }
        else {
          eVar5 = detail::make_error_code(invalid_argument);
          local_e8 = eVar5._M_cat;
          local_f0 = eVar5._M_value;
          *(ulong *)in_RCX = CONCAT44(uStack_ec,local_f0);
          in_RCX->_M_cat = local_e8;
        }
      }
    }
    else {
      file_status::file_status(&local_f8,&fs_to);
      bVar1 = is_regular_file(&local_f8);
      file_status::~file_status(&local_f8);
      if (bVar1) {
        EVar3 = operator&(in_DX,directories_only);
        if (EVar3 == none) {
          EVar3 = operator&(in_DX,create_symlinks);
          if (EVar3 == none) {
            EVar3 = operator&(in_DX,create_hard_links);
            if (EVar3 == none) {
              file_status::file_status(&local_120,&local_48);
              bVar1 = is_directory(&local_120);
              file_status::~file_status(&local_120);
              if (bVar1) {
                path::filename(&local_160,(path *)dst);
                operator/(&local_140,(path *)src,&local_160);
                copy_file((path *)dst,&local_140,in_DX,in_RCX);
                path::~path(&local_140);
                path::~path(&local_160);
              }
              else {
                copy_file((path *)dst,(path *)src,in_DX,in_RCX);
              }
            }
            else {
              create_hard_link((path *)dst,(path *)src,in_RCX);
            }
          }
          else {
            bVar1 = path::is_absolute((path *)dst);
            if (bVar1) {
              path::path(&local_118,(path *)dst);
            }
            else {
              canonical(&local_118,(path *)dst,in_RCX);
            }
            create_symlink(&local_118,(path *)src,in_RCX);
            path::~path(&local_118);
          }
        }
      }
      else {
        file_status::file_status(&local_168,&fs_to);
        bVar2 = is_directory(&local_168);
        bVar1 = false;
        if (bVar2) {
          EVar3 = operator&(in_DX,create_symlinks);
          bVar1 = EVar3 != none;
        }
        file_status::~file_status(&local_168);
        if (bVar1) {
          eVar5 = detail::make_error_code(is_a_directory);
          local_170 = eVar5._M_cat;
          local_178 = eVar5._M_value;
          *(ulong *)in_RCX = CONCAT44(uStack_174,local_178);
          in_RCX->_M_cat = local_170;
        }
        else {
          file_status::file_status(&local_180,&fs_to);
          bVar2 = is_directory(&local_180);
          bVar1 = false;
          if ((bVar2) && (bVar1 = true, in_DX != none)) {
            EVar3 = operator&(in_DX,recursive);
            bVar1 = EVar3 != none;
          }
          file_status::~file_status(&local_180);
          if (bVar1) {
            file_status::file_status
                      ((file_status *)
                       &iter._impl.
                        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,&local_48);
            bVar1 = exists((file_status *)
                           &iter._impl.
                            super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
            file_status::~file_status
                      ((file_status *)
                       &iter._impl.
                        super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              create_directory((path *)src,(path *)dst,in_RCX);
              bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
              if (bVar1) {
                local_74 = 1;
                goto LAB_002c9efd;
              }
            }
            directory_iterator::directory_iterator
                      ((directory_iterator *)local_198,(path *)dst,in_RCX);
            while( true ) {
              directory_iterator::directory_iterator(&local_1a8);
              bVar1 = directory_iterator::operator!=((directory_iterator *)local_198,&local_1a8);
              directory_iterator::~directory_iterator(&local_1a8);
              if (!bVar1) break;
              bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
              if (!bVar1) {
                pdVar4 = directory_iterator::operator->((directory_iterator *)local_198);
                dst_00 = (EVP_PKEY_CTX *)directory_entry::path(pdVar4);
                pdVar4 = directory_iterator::operator->((directory_iterator *)local_198);
                this = directory_entry::path(pdVar4);
                path::filename(&local_1e8,this);
                operator/(&local_1c8,(path *)src,&local_1e8);
                operator|(in_DX,0x8000);
                copy(dst_00,(EVP_PKEY_CTX *)&local_1c8);
                path::~path(&local_1c8);
                path::~path(&local_1e8);
              }
              bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
              if (bVar1) {
                local_74 = 1;
                goto LAB_002c9ed6;
              }
              directory_iterator::increment((directory_iterator *)local_198,in_RCX);
            }
            local_74 = 2;
LAB_002c9ed6:
            directory_iterator::~directory_iterator((directory_iterator *)local_198);
            if (local_74 != 2) goto LAB_002c9efd;
          }
        }
      }
    }
  }
  else {
    eVar5 = detail::make_error_code(invalid_argument);
    local_c8 = eVar5._M_cat;
    local_d0 = eVar5._M_value;
    *(ulong *)in_RCX = CONCAT44(uStack_cc,local_d0);
    in_RCX->_M_cat = local_c8;
  }
  local_74 = 1;
LAB_002c9efd:
  file_status::~file_status(&local_48);
  file_status::~file_status(&fs_to);
  return extraout_EAX;
}

Assistant:

GHC_INLINE void copy(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tec;
    file_status fs_from, fs_to;
    ec.clear();
    if ((options & (copy_options::skip_symlinks | copy_options::copy_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_from = symlink_status(from, ec);
    }
    else {
        fs_from = status(from, ec);
    }
    if (!exists(fs_from)) {
        if (!ec) {
            ec = detail::make_error_code(detail::portable_error::not_found);
        }
        return;
    }
    if ((options & (copy_options::skip_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_to = symlink_status(to, tec);
    }
    else {
        fs_to = status(to, tec);
    }
    if (is_other(fs_from) || is_other(fs_to) || (is_directory(fs_from) && is_regular_file(fs_to)) || (exists(fs_to) && equivalent(from, to, ec))) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
    }
    else if (is_symlink(fs_from)) {
        if ((options & copy_options::skip_symlinks) == copy_options::none) {
            if (!exists(fs_to) && (options & copy_options::copy_symlinks) != copy_options::none) {
                copy_symlink(from, to, ec);
            }
            else {
                ec = detail::make_error_code(detail::portable_error::invalid_argument);
            }
        }
    }
    else if (is_regular_file(fs_from)) {
        if ((options & copy_options::directories_only) == copy_options::none) {
            if ((options & copy_options::create_symlinks) != copy_options::none) {
                create_symlink(from.is_absolute() ? from : canonical(from, ec), to, ec);
            }
#ifndef GHC_OS_WEB
            else if ((options & copy_options::create_hard_links) != copy_options::none) {
                create_hard_link(from, to, ec);
            }
#endif
            else if (is_directory(fs_to)) {
                copy_file(from, to / from.filename(), options, ec);
            }
            else {
                copy_file(from, to, options, ec);
            }
        }
    }